

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall
ArmParser::decodeArmOpcode(ArmParser *this,string *name,tArmOpcode *opcode,ArmOpcodeVariables *vars)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  size_t local_40;
  size_t pos;
  char *encoding;
  ArmOpcodeVariables *vars_local;
  tArmOpcode *opcode_local;
  string *name_local;
  ArmParser *this_local;
  
  (vars->Opcode).a = '\0';
  (vars->Opcode).c = '\0';
  (vars->Opcode).s = false;
  pos = (size_t)opcode->name;
  local_40 = 0;
  encoding = (char *)vars;
  vars_local = (ArmOpcodeVariables *)opcode;
  opcode_local = (tArmOpcode *)name;
  name_local = (string *)this;
  do {
    sVar2 = local_40;
    if (*(char *)pos == '\0') {
      uVar5 = std::__cxx11::string::size();
      return uVar5 <= sVar2;
    }
    sVar7 = pos + 1;
    switch(*(undefined1 *)pos) {
    case 0x41:
      pos = sVar7;
      bVar3 = decodeAddressingMode(this,(string *)opcode_local,&local_40,(uchar *)(encoding + 1));
      if (!bVar3) {
        return false;
      }
      break;
    default:
      pos = sVar7;
      uVar5 = std::__cxx11::string::size();
      if (uVar5 <= sVar2) {
        return false;
      }
      cVar1 = *(char *)(pos - 1);
      local_40 = local_40 + 1;
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)opcode_local);
      if (cVar1 != *pcVar6) {
        return false;
      }
      break;
    case 0x43:
      pos = sVar7;
      iVar4 = decodeCondition(this,(string *)opcode_local,&local_40);
      *encoding = (char)iVar4;
      break;
    case 0x53:
      pos = sVar7;
      decodeS(this,(string *)opcode_local,&local_40,(bool *)(encoding + 2));
      break;
    case 0x58:
      pos = sVar7;
      bVar3 = decodeXY(this,(string *)opcode_local,&local_40,(bool *)(encoding + 3));
      if (!bVar3) {
        return false;
      }
      break;
    case 0x59:
      pos = sVar7;
      bVar3 = decodeXY(this,(string *)opcode_local,&local_40,(bool *)(encoding + 4));
      if (!bVar3) {
        return false;
      }
    }
  } while( true );
}

Assistant:

bool ArmParser::decodeArmOpcode(const std::string& name, const tArmOpcode& opcode, ArmOpcodeVariables& vars)
{
	vars.Opcode.c = vars.Opcode.a = 0;
	vars.Opcode.s = false;

	const char* encoding = opcode.name;
	size_t pos = 0;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'C':	// condition
			vars.Opcode.c = decodeCondition(name,pos);
			break;
		case 'S':	// set flag
			decodeS(name,pos,vars.Opcode.s);
			break;
		case 'A':	// addressing mode
			CHECK(decodeAddressingMode(name,pos,vars.Opcode.a));
			break;
		case 'X':	// x flag
			CHECK(decodeXY(name,pos,vars.Opcode.x));
			break;
		case 'Y':	// y flag
			CHECK(decodeXY(name,pos,vars.Opcode.y));
			break;
		default:
			CHECK(pos < name.size());
			CHECK(*(encoding-1) == name[pos++]);
			break;
		}
	}

	return pos >= name.size();
}